

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall MidiSimulationDataGenerator::injectBurstErrors(MidiSimulationDataGenerator *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  
  iVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  uVar1 = this->mSimulationSampleRateHz;
  uVar2 = this->mSettings->mBitRate;
  srand(1);
  for (uVar5 = (ulong)iVar3; uVar5 < (ulong)(long)(int)(iVar3 + (uVar1 / uVar2) * 0xd);
      uVar5 = uVar5 + 1) {
    SimulationChannelDescriptor::Advance((int)this + 0x10);
    iVar4 = rand();
    if ((float)iVar4 < 4.2949674e+08) {
      SimulationChannelDescriptor::Transition();
    }
  }
  return;
}

Assistant:

void MidiSimulationDataGenerator::injectBurstErrors()
{
    // This function adds random transitions while advancing the stream.
    // Pseudocode Example:
    // write numSamplesToOverwrite samples of garbage.
    // done.

    const int startingSample = mMidiSimulationData.GetCurrentSampleNumber();
    U32 samples_per_bit = mSimulationSampleRateHz / mSettings->mBitRate;
    const int numSamplesToOverwrite = 13 * samples_per_bit;
    U64 currentSample = startingSample;
    int r;
    float probability = 0.2f;
    srand( 1 ); // Default seed, will produce repeatable sequences.
    while( currentSample < ( startingSample + numSamplesToOverwrite ) )
    {
        mMidiSimulationData.Advance( 1 );
        r = rand();
        if( ( float )r < ( ( float )RAND_MAX * probability ) )
        {
            mMidiSimulationData.Transition(); //
        }
        currentSample++;
    }
}